

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O1

void __thiscall
GdlSetAttrItem::MergeColRangeAndPriority
          (GdlSetAttrItem *this,GrcManager *pcman,GrcFont *pfont,int ipavsFlags,int ipavsRange,
          int ipavsPriority)

{
  GrcSymbolTable *pGVar1;
  uint uVar2;
  GrcManager *pGVar3;
  int iVar4;
  Symbol pGVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GdlBinaryExpression *pGVar6;
  GdlBinaryExpression *this_00;
  undefined4 extraout_var_02;
  GdlAttrValueSpec *this_01;
  bool fCanSub;
  SymbolSet setpsymBogus;
  GdlExpression *local_120;
  undefined1 local_111;
  GdlBinaryExpression *local_110;
  uint local_104;
  GrcManager *local_100;
  Symbol local_f8;
  Symbol local_f0;
  GrcFont *local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<GrcSymbolTableEntry_*,_GrcSymbolTableEntry_*,_std::_Identity<GrcSymbolTableEntry_*>,_SymbolLess,_std::allocator<GrcSymbolTableEntry_*>_>
  local_60;
  
  if ((ipavsPriority & ipavsRange) == 0xffffffff) {
    return;
  }
  pGVar1 = pcman->m_psymtbl;
  local_104 = ipavsFlags;
  local_100 = pcman;
  local_e8 = pfont;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"collision","");
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"flags","");
  GrcStructName::GrcStructName((GrcStructName *)&local_60,&local_c0,&local_e0);
  pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,(GrcStructName *)&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_f0 = pGVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  pGVar1 = local_100->m_psymtbl;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"=","");
  local_f8 = GrcSymbolTable::FindSymbol(pGVar1,&local_80);
  uVar2 = local_104;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = local_100;
  if ((int)uVar2 < 0) {
    local_120 = (GdlExpression *)0x0;
  }
  else {
    iVar4 = (**(this->m_vpavs).
               super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2]->m_pexpValue->_vptr_GdlExpression)();
    local_120 = (GdlExpression *)CONCAT44(extraout_var,iVar4);
  }
  if (ipavsRange < 0) {
    local_110 = (GdlBinaryExpression *)0x0;
  }
  else {
    iVar4 = (**(this->m_vpavs).
               super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
               super__Vector_impl_data._M_start[(uint)ipavsRange]->m_pexpValue->_vptr_GdlExpression)
                      ();
    local_110 = (GdlBinaryExpression *)CONCAT44(extraout_var_00,iVar4);
  }
  if (ipavsPriority < 0) {
    this_00 = (GdlBinaryExpression *)0x0;
  }
  else {
    iVar4 = (**(this->m_vpavs).
               super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
               super__Vector_impl_data._M_start[(uint)ipavsPriority]->m_pexpValue->
               _vptr_GdlExpression)();
    this_00 = (GdlBinaryExpression *)CONCAT44(extraout_var_01,iVar4);
  }
  pGVar1 = pGVar3->m_psymtbl;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"+","");
  pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((local_110 == (GdlBinaryExpression *)0x0) || (this_00 == (GdlBinaryExpression *)0x0)) {
    if ((local_120 == (GdlExpression *)0x0) || (local_110 == (GdlBinaryExpression *)0x0)) {
      if ((local_120 == (GdlExpression *)0x0) || (this_00 == (GdlBinaryExpression *)0x0)) {
        if (local_110 != (GdlBinaryExpression *)0x0) {
          this_00 = local_110;
        }
      }
      else {
        pGVar6 = (GdlBinaryExpression *)operator_new(0x50);
        GdlBinaryExpression::GdlBinaryExpression
                  (pGVar6,pGVar5,&this_00->super_GdlExpression,local_120);
        this_00 = pGVar6;
      }
    }
    else {
      this_00 = (GdlBinaryExpression *)operator_new(0x50);
      GdlBinaryExpression::GdlBinaryExpression
                (this_00,pGVar5,&local_110->super_GdlExpression,local_120);
    }
  }
  else {
    pGVar6 = (GdlBinaryExpression *)operator_new(0x50);
    GdlBinaryExpression::GdlBinaryExpression
              (pGVar6,pGVar5,&local_110->super_GdlExpression,&this_00->super_GdlExpression);
    this_00 = pGVar6;
    if (local_120 != (GdlExpression *)0x0) {
      this_00 = (GdlBinaryExpression *)operator_new(0x50);
      GdlBinaryExpression::GdlBinaryExpression(this_00,pGVar5,local_120,(GdlExpression *)pGVar6);
    }
  }
  iVar4 = (*(this_00->super_GdlExpression)._vptr_GdlExpression[0xf])
                    (this_00,local_100->m_pgax,0xffff,&local_60,local_e8,0,&local_111);
  if (this_00 != (GdlBinaryExpression *)CONCAT44(extraout_var_02,iVar4)) {
    (*(this_00->super_GdlExpression)._vptr_GdlExpression[2])(this_00);
  }
  this_01 = (GdlAttrValueSpec *)operator_new(0x48);
  GdlAttrValueSpec::GdlAttrValueSpec
            (this_01,local_f0,local_f8,(GdlExpression *)CONCAT44(extraout_var_02,iVar4));
  if ((int)local_104 < 0) {
    if (ipavsRange < 0) {
      ReplaceAttrSetting(this,ipavsPriority,this_01);
      goto LAB_00143380;
    }
    ReplaceAttrSetting(this,ipavsRange,this_01);
  }
  else {
    ReplaceAttrSetting(this,local_104,this_01);
    if (-1 < ipavsRange) {
      EraseAttrSetting(this,ipavsRange);
    }
  }
  if (-1 < ipavsPriority) {
    EraseAttrSetting(this,ipavsPriority);
  }
LAB_00143380:
  std::
  _Rb_tree<GrcSymbolTableEntry_*,_GrcSymbolTableEntry_*,_std::_Identity<GrcSymbolTableEntry_*>,_SymbolLess,_std::allocator<GrcSymbolTableEntry_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void GdlSetAttrItem::MergeColRangeAndPriority(GrcManager * pcman, GrcFont * pfont,
	int ipavsFlags, int ipavsRange, int ipavsPriority)
{
	if (ipavsRange == -1 && ipavsPriority == -1)
		return;

	Symbol psymCollisionFlags = pcman->SymbolTable()->FindSymbol(GrcStructName("collision", "flags"));
	Symbol psymEquals = pcman->SymbolTable()->FindSymbol("=");

	GdlExpression * pexpFlagsOld = nullptr;
	GdlExpression * pexpRange = nullptr;
	GdlExpression * pexpPriority = nullptr;
	if (ipavsFlags >= 0)
		pexpFlagsOld = m_vpavs[ipavsFlags]->m_pexpValue->Clone();
	if (ipavsRange >= 0)
		pexpRange = m_vpavs[ipavsRange]->m_pexpValue->Clone();
	if (ipavsPriority >= 0)
		pexpPriority = m_vpavs[ipavsPriority]->m_pexpValue->Clone();

	Symbol psymPlus = pcman->SymbolTable()->FindSymbol("+");
	GdlExpression * pexpFlagsTemp = nullptr;
	GdlExpression * pexpFlags;
	SymbolSet setpsymBogus;
	bool fCanSub;
	if (pexpRange && pexpPriority)
	{
		pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpRange, pexpPriority);
		if (pexpFlagsOld)
			pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpFlagsOld, pexpFlagsTemp);
	}
	else if (pexpRange && pexpFlagsOld)
		pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpRange, pexpFlagsOld);
	else if (pexpPriority && pexpFlagsOld)
		pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpPriority, pexpFlagsOld);
	else if (pexpRange)
		pexpFlagsTemp = pexpRange;
	else if (pexpPriority)
		pexpFlagsTemp = pexpPriority;

	assert(pexpFlagsTemp);
	pexpFlags = pexpFlagsTemp->SimplifyAndUnscale(pcman->GlyphAttrMatrix(), -1, setpsymBogus, pfont, false, &fCanSub);
	if (pexpFlagsTemp != pexpFlags)
		delete pexpFlagsTemp;

	GdlAttrValueSpec * pavsFlagsNew = new GdlAttrValueSpec(psymCollisionFlags, psymEquals, pexpFlags);

	if (ipavsFlags >= 0)
	{
		ReplaceAttrSetting(ipavsFlags, pavsFlagsNew);
		if (ipavsRange >= 0)
			EraseAttrSetting(ipavsRange);
		if (ipavsPriority >= 0)
			EraseAttrSetting(ipavsPriority);
	}
	else if (ipavsRange >= 0)
	{
		ReplaceAttrSetting(ipavsRange, pavsFlagsNew);
		if (ipavsPriority >= 0)
			EraseAttrSetting(ipavsPriority);
	}
	else
	{
		ReplaceAttrSetting(ipavsPriority, pavsFlagsNew);
	}
}